

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int getFullTerritoryNameInLocaleInAlphabetUtf8
              (char *territoryName,Territory territory,int alternative,char *locale,
              Alphabet alphabet)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  Alphabet AVar4;
  size_t sVar5;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  byte *pbVar9;
  uint uVar10;
  long lVar11;
  byte *pbVar12;
  undefined4 in_register_00000034;
  char *__src;
  int iVar13;
  bool bVar14;
  int iStack_40;
  char acStack_3c [4];
  char *pcStack_38;
  
  pcStack_38 = (char *)CONCAT44(in_register_00000034,territory);
  if (0x1b < (uint)alphabet) {
    *territoryName = '\0';
    return 0;
  }
  if (((territoryName == (char *)0x0) || (alternative < 0)) ||
     ((uint)(territory + ~TERRITORY_AAA) < 0xfffffdeb)) {
    if (territoryName != (char *)0x0) {
      *territoryName = '\0';
      return 0;
    }
    return 0;
  }
  if (locale == (char *)0x0) {
    ppcVar7 = TERRITORY_FULL_NAME_LOCAL;
LAB_0016c20b:
    iVar3 = (int)pcStack_38;
    if (*ppcVar7 != (char *)0x0) goto LAB_0016c21f;
  }
  else {
    sVar5 = strlen(locale);
    acStack_3c[0] = '\0';
    acStack_3c[1] = '\0';
    acStack_3c[2] = '\0';
    acStack_3c[3] = '\0';
    pcVar6 = strchr(locale,0x5f);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strchr(locale,0x2d);
    }
    iVar3 = (int)sVar5;
    if (pcVar6 != (char *)0x0) {
      iVar3 = (int)pcVar6 - (int)locale;
    }
    iVar13 = 3;
    if (iVar3 < 3) {
      iVar13 = iVar3;
    }
    memcpy(acStack_3c,locale,(long)iVar13);
    acStack_3c[iVar13] = '\0';
    makeUppercase(acStack_3c);
    lVar2 = 0;
    do {
      lVar11 = lVar2;
      if (lVar11 + 0x10 == 0x1c0) {
        iVar3 = (int)pcStack_38;
        goto LAB_0016c218;
      }
      iVar3 = strcmp(*(char **)((long)&LOCALE_REGISTRY[0].locale + lVar11),acStack_3c);
      lVar2 = lVar11 + 0x10;
    } while (iVar3 != 0);
    ppcVar7 = *(char ***)((long)&LOCALE_REGISTRY[0].territoryFullNames + lVar11);
    iVar3 = (int)pcStack_38;
    if (ppcVar7 != (char **)0x0) goto LAB_0016c20b;
  }
LAB_0016c218:
  ppcVar7 = TERRITORY_FULL_NAME_EN;
LAB_0016c21f:
  *territoryName = '\0';
  pcVar6 = ppcVar7[iVar3 - 0x3e9];
  pcStack_38 = pcVar6;
  iStack_40 = alternative;
  do {
    while( true ) {
      pcVar8 = strchr(pcVar6,0x7c);
      __src = pcStack_38;
      if (_ALPHABET_MIN < alphabet) break;
LAB_0016c319:
      if (pcVar8 == (char *)0x0) {
        if (iStack_40 < 1) {
          strcpy(territoryName,__src);
          return 1;
        }
        return 0;
      }
      bVar14 = iStack_40 == 0;
      iStack_40 = iStack_40 + -1;
      if (bVar14) {
        iVar13 = (int)pcVar8 - (int)__src;
        iVar3 = 0x6e;
        if (iVar13 < 0x6e) {
          iVar3 = iVar13;
        }
        memcpy(territoryName,__src,(long)iVar3);
        territoryName[iVar3] = '\0';
        return 1;
      }
      pcVar6 = pcVar8 + 1;
      pcStack_38 = pcVar6;
    }
    pbVar9 = (byte *)territoryName;
    if (pcVar8 == (char *)0x0) {
      strcpy(territoryName,pcVar6);
    }
    else {
      iVar3 = (int)pcVar8 - (int)pcVar6;
      if (0x6d < iVar3) {
        iVar3 = 0x6e;
      }
      memcpy(territoryName,pcVar6,(long)iVar3);
      territoryName[iVar3] = '\0';
    }
    do {
      do {
        pbVar12 = pbVar9;
        bVar1 = *pbVar12;
        if (bVar1 == 0) {
          AVar4 = ALPHABET_ROMAN;
          goto LAB_0016c300;
        }
        pbVar9 = pbVar12 + 1;
      } while (bVar1 < 0xc0);
      if (-1 < (char)pbVar12[1]) {
LAB_0016c2fd:
        AVar4 = _ALPHABET_MIN;
        goto LAB_0016c300;
      }
      uVar10 = ((uint)bVar1 * 0x40 + (pbVar12[1] & 0x3f)) - 0x3000;
      if ((int)uVar10 < 0x800) {
        pbVar9 = pbVar12 + 2;
      }
      else {
        if ((-1 < (char)pbVar12[2]) ||
           (uVar10 = (uVar10 * 0x40 + (pbVar12[2] & 0x3f)) - 0x20000, 0xffff < (int)uVar10))
        goto LAB_0016c2fd;
        pbVar9 = pbVar12 + 3;
      }
    } while (""[uVar10 >> 6 & 0x3ff] == '\0');
    AVar4 = (Alphabet)""[uVar10 >> 6 & 0x3ff];
LAB_0016c300:
    __src = pcVar6;
    if (AVar4 == alphabet) goto LAB_0016c319;
    if (pcVar8 == (char *)0x0) {
      return 0;
    }
    pcVar6 = pcVar8 + 1;
  } while( true );
}

Assistant:

int getFullTerritoryNameInLocaleInAlphabetUtf8(char *territoryName, enum Territory territory, int alternative,
                                               const char *locale, enum Alphabet alphabet) {
    ASSERT(territoryName);
    ASSERT((_TERRITORY_MIN < territory) && (territory < _TERRITORY_MAX));
    if ((alphabet <= _ALPHABET_MIN) || (alphabet >= _ALPHABET_MAX)) {
        *territoryName = 0;
        return 0;
    }
    return getFullTerritoryName_internal(territoryName, territory, alternative, locale, alphabet);
}